

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O0

void ImVector_ImDrawVert_resizeT(ImVector_ImDrawVert *self,int new_size,ImDrawVert v)

{
  int new_size_local;
  ImVector_ImDrawVert *self_local;
  
  ImVector<ImDrawVert>::resize(self,new_size,&v);
  return;
}

Assistant:

CIMGUI_API void ImVector_ImDrawVert_resizeT(ImVector_ImDrawVert* self,int new_size,const ImDrawVert v)
{
    return self->resize(new_size,v);
}